

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O1

void cf2_glyphpath_curveTo
               (CF2_GlyphPath glyphpath,CF2_F16Dot16 x1,CF2_F16Dot16 y1,CF2_F16Dot16 x2,
               CF2_F16Dot16 y2,CF2_F16Dot16 x3,CF2_F16Dot16 y3)

{
  FT_Fast *pFVar1;
  long lVar2;
  FT_Vector start;
  FT_Vector nextP1;
  CF2_F16Dot16 yOffset3;
  CF2_F16Dot16 yOffset1;
  CF2_F16Dot16 xOffset1;
  FT_Vector P0;
  CF2_F16Dot16 xOffset3;
  int local_54;
  int local_50;
  int local_4c;
  FT_Vector local_48;
  int local_34;
  
  cf2_glyphpath_computeOffset
            (glyphpath,(CF2_F16Dot16)(glyphpath->currentCS).x,(CF2_F16Dot16)(glyphpath->currentCS).y
             ,x1,y1,&local_4c,&local_50);
  cf2_glyphpath_computeOffset(glyphpath,x2,y2,x3,y3,&local_34,&local_54);
  pFVar1 = &glyphpath->callbacks->windingMomentum;
  *pFVar1 = *pFVar1 + ((y2 - y1 >> 0x10) * (x1 >> 0x10) - (x2 - x1 >> 0x10) * (y1 >> 0x10));
  start.x = (long)((int)(glyphpath->currentCS).x + local_4c);
  start.y = (long)((int)(glyphpath->currentCS).y + local_50);
  nextP1.x = (long)(local_4c + x1);
  lVar2 = (long)(local_50 + y1);
  local_48.x = start.x;
  local_48.y = start.y;
  if (glyphpath->moveIsPending != '\0') {
    cf2_glyphpath_pushMove(glyphpath,start);
    glyphpath->moveIsPending = '\0';
    glyphpath->pathIsOpen = '\x01';
    (glyphpath->offsetStart1).x = nextP1.x;
    (glyphpath->offsetStart1).y = lVar2;
  }
  if (glyphpath->elemIsQueued != '\0') {
    nextP1.y = lVar2;
    cf2_glyphpath_pushPrevElem(glyphpath,&glyphpath->hintMap,&local_48,nextP1,'\0');
  }
  glyphpath->elemIsQueued = '\x01';
  glyphpath->prevElemOp = 4;
  (glyphpath->prevElemP0).x = local_48.x;
  (glyphpath->prevElemP0).y = local_48.y;
  (glyphpath->prevElemP1).x = nextP1.x;
  (glyphpath->prevElemP1).y = lVar2;
  (glyphpath->prevElemP2).x = (long)(x2 + local_34);
  (glyphpath->prevElemP2).y = (long)(y2 + local_54);
  (glyphpath->prevElemP3).x = (long)(local_34 + x3);
  (glyphpath->prevElemP3).y = (long)(local_54 + y3);
  if (glyphpath->hintMask->isNew != '\0') {
    cf2_hintmap_build(&glyphpath->hintMap,glyphpath->hStemHintArray,glyphpath->vStemHintArray,
                      glyphpath->hintMask,glyphpath->hintOriginY,'\0');
  }
  (glyphpath->currentCS).x = (long)x3;
  (glyphpath->currentCS).y = (long)y3;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_glyphpath_curveTo( CF2_GlyphPath  glyphpath,
                         CF2_Fixed      x1,
                         CF2_Fixed      y1,
                         CF2_Fixed      x2,
                         CF2_Fixed      y2,
                         CF2_Fixed      x3,
                         CF2_Fixed      y3 )
  {
    CF2_Fixed  xOffset1, yOffset1, xOffset3, yOffset3;
    FT_Vector  P0, P1, P2, P3;


    /* TODO: ignore zero length portions of curve?? */
    cf2_glyphpath_computeOffset( glyphpath,
                                 glyphpath->currentCS.x,
                                 glyphpath->currentCS.y,
                                 x1,
                                 y1,
                                 &xOffset1,
                                 &yOffset1 );
    cf2_glyphpath_computeOffset( glyphpath,
                                 x2,
                                 y2,
                                 x3,
                                 y3,
                                 &xOffset3,
                                 &yOffset3 );

    /* add momentum from the middle segment */
    glyphpath->callbacks->windingMomentum =
      ADD_INT32( glyphpath->callbacks->windingMomentum,
                 cf2_getWindingMomentum( x1, y1, x2, y2 ) );

    /* construct offset points */
    P0.x = ADD_INT32( glyphpath->currentCS.x, xOffset1 );
    P0.y = ADD_INT32( glyphpath->currentCS.y, yOffset1 );
    P1.x = ADD_INT32( x1, xOffset1 );
    P1.y = ADD_INT32( y1, yOffset1 );
    /* note: preserve angle of final segment by using offset3 at both ends */
    P2.x = ADD_INT32( x2, xOffset3 );
    P2.y = ADD_INT32( y2, yOffset3 );
    P3.x = ADD_INT32( x3, xOffset3 );
    P3.y = ADD_INT32( y3, yOffset3 );

    if ( glyphpath->moveIsPending )
    {
      /* emit offset 1st point as MoveTo */
      cf2_glyphpath_pushMove( glyphpath, P0 );

      glyphpath->moveIsPending = FALSE;
      glyphpath->pathIsOpen    = TRUE;

      glyphpath->offsetStart1 = P1;              /* record second point */
    }

    if ( glyphpath->elemIsQueued )
    {
      FT_ASSERT( cf2_hintmap_isValid( &glyphpath->hintMap ) ||
                 glyphpath->hintMap.count == 0              );

      cf2_glyphpath_pushPrevElem( glyphpath,
                                  &glyphpath->hintMap,
                                  &P0,
                                  P1,
                                  FALSE );
    }

    /* queue the current element with offset points */
    glyphpath->elemIsQueued = TRUE;
    glyphpath->prevElemOp   = CF2_PathOpCubeTo;
    glyphpath->prevElemP0   = P0;
    glyphpath->prevElemP1   = P1;
    glyphpath->prevElemP2   = P2;
    glyphpath->prevElemP3   = P3;

    /* update current map */
    if ( cf2_hintmask_isNew( glyphpath->hintMask ) )
      cf2_hintmap_build( &glyphpath->hintMap,
                         glyphpath->hStemHintArray,
                         glyphpath->vStemHintArray,
                         glyphpath->hintMask,
                         glyphpath->hintOriginY,
                         FALSE );

    glyphpath->currentCS.x = x3;       /* pre-offset current point */
    glyphpath->currentCS.y = y3;
  }